

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_pileup_engine.cpp
# Opt level: O1

bool __thiscall
BamTools::PileupEngine::PileupEnginePrivate::AddAlignment
          (PileupEnginePrivate *this,BamAlignment *al)

{
  pointer pBVar1;
  pointer pBVar2;
  int32_t iVar3;
  int iVar4;
  pointer this_00;
  
  iVar4 = al->RefID;
  if (this->IsFirstAlignment == true) {
    this->CurrentId = iVar4;
    this->CurrentPosition = al->Position;
    pBVar1 = (this->CurrentAlignments).
             super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->CurrentAlignments).
             super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = pBVar1;
    if (pBVar2 != pBVar1) {
      do {
        BamAlignment::~BamAlignment(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pBVar2);
      (this->CurrentAlignments).
      super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar1;
    }
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (&this->CurrentAlignments,al);
    this->IsFirstAlignment = false;
  }
  else if (iVar4 == this->CurrentId) {
    if (al->Position != this->CurrentPosition) {
      if (al->Position < this->CurrentPosition) goto LAB_001ac4bd;
      if (this->CurrentPosition < al->Position) {
        do {
          ApplyVisitors(this);
          iVar4 = this->CurrentPosition + 1;
          this->CurrentPosition = iVar4;
        } while (iVar4 < al->Position);
      }
    }
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (&this->CurrentAlignments,al);
  }
  else {
    if (iVar4 < this->CurrentId) {
LAB_001ac4bd:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Pileup::Run() : Data not sorted correctly!",0x2a);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      return false;
    }
    while ((this->CurrentAlignments).
           super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (this->CurrentAlignments).
           super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      ApplyVisitors(this);
      this->CurrentPosition = this->CurrentPosition + 1;
    }
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (&this->CurrentAlignments,al);
    iVar3 = al->Position;
    this->CurrentId = al->RefID;
    this->CurrentPosition = iVar3;
  }
  return true;
}

Assistant:

bool PileupEngine::PileupEnginePrivate::AddAlignment(const BamAlignment& al)
{

    // if first time
    if (IsFirstAlignment) {

        // set initial markers
        CurrentId = al.RefID;
        CurrentPosition = al.Position;

        // store first entry
        CurrentAlignments.clear();
        CurrentAlignments.push_back(al);

        // set flag & return
        IsFirstAlignment = false;
        return true;
    }

    // if same reference
    if (al.RefID == CurrentId) {

        // if same position, store and move on
        if (al.Position == CurrentPosition) CurrentAlignments.push_back(al);

        // if less than CurrentPosition - sorting error => ABORT
        else if (al.Position < CurrentPosition) {
            std::cerr << "Pileup::Run() : Data not sorted correctly!" << std::endl;
            return false;
        }

        // else print pileup data until 'catching up' to CurrentPosition
        else {
            while (al.Position > CurrentPosition) {
                ApplyVisitors();
                ++CurrentPosition;
            }
            CurrentAlignments.push_back(al);
        }
    }

    // if reference ID less than CurrentId - sorting error => ABORT
    else if (al.RefID < CurrentId) {
        std::cerr << "Pileup::Run() : Data not sorted correctly!" << std::endl;
        return false;
    }

    // else moved forward onto next reference
    else {

        // print any remaining pileup data from previous reference
        while (!CurrentAlignments.empty()) {
            ApplyVisitors();
            ++CurrentPosition;
        }

        // store first entry on this new reference, update markers
        CurrentAlignments.clear();
        CurrentAlignments.push_back(al);
        CurrentId = al.RefID;
        CurrentPosition = al.Position;
    }

    return true;
}